

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileMtlImporter::getTextureOption
          (ObjFileMtlImporter *this,bool *clamp,int *clampIndex,aiString **out)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  reference pcVar5;
  char *pcVar6;
  bool bVar7;
  int local_dc;
  int i;
  char local_bc [8];
  char value_1 [12];
  DataArrayIt it_1;
  char local_7b [3];
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Stack_78;
  char value [3];
  DataArrayIt it;
  int skipToken;
  char *pPtr;
  aiString **out_local;
  int *clampIndex_local;
  bool *clamp_local;
  ObjFileMtlImporter *this_local;
  
  _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  do {
    bVar1 = isEndOfBuffer<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                       (this->m_DataIt)._M_current,
                       (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                       (this->m_DataItEnd)._M_current);
    bVar7 = false;
    if (!bVar1) {
      pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      bVar7 = *pcVar5 == '-';
    }
    if (!bVar7) {
      return;
    }
    pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    it._M_current._4_4_ = 1;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::size();
    iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
    if (iVar3 == 0) {
      _Stack_78._M_current = (this->m_DataItEnd)._M_current;
      _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,_Stack_78);
      CopyNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                (_Var4,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                       (this->m_DataItEnd)._M_current,local_7b,3);
      iVar3 = ASSIMP_strincmp(local_7b,"on",2);
      if (iVar3 == 0) {
        *clamp = true;
      }
      it._M_current._4_4_ = 2;
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      uVar2 = std::__cxx11::string::size();
      iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
      if (iVar3 == 0) {
        value_1._4_8_ = (this->m_DataItEnd)._M_current;
        _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,
                           (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                           value_1._4_8_);
        CopyNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  (_Var4,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                         (this->m_DataItEnd)._M_current,local_bc,0xc);
        iVar3 = ASSIMP_strincmp(local_bc,"cube_top",8);
        if (iVar3 == 0) {
          *clampIndex = 7;
          *out = this->m_pModel->m_pCurrentMaterial->textureReflection;
        }
        else {
          iVar3 = ASSIMP_strincmp(local_bc,"cube_bottom",0xb);
          if (iVar3 == 0) {
            *clampIndex = 8;
            *out = this->m_pModel->m_pCurrentMaterial->textureReflection + 1;
          }
          else {
            iVar3 = ASSIMP_strincmp(local_bc,"cube_front",10);
            if (iVar3 == 0) {
              *clampIndex = 9;
              *out = this->m_pModel->m_pCurrentMaterial->textureReflection + 2;
            }
            else {
              iVar3 = ASSIMP_strincmp(local_bc,"cube_back",9);
              if (iVar3 == 0) {
                *clampIndex = 10;
                *out = this->m_pModel->m_pCurrentMaterial->textureReflection + 3;
              }
              else {
                iVar3 = ASSIMP_strincmp(local_bc,"cube_left",9);
                if (iVar3 == 0) {
                  *clampIndex = 0xb;
                  *out = this->m_pModel->m_pCurrentMaterial->textureReflection + 4;
                }
                else {
                  iVar3 = ASSIMP_strincmp(local_bc,"cube_right",10);
                  if (iVar3 == 0) {
                    *clampIndex = 0xc;
                    *out = this->m_pModel->m_pCurrentMaterial->textureReflection + 5;
                  }
                  else {
                    iVar3 = ASSIMP_strincmp(local_bc,"sphere",6);
                    if (iVar3 == 0) {
                      *clampIndex = 6;
                      *out = this->m_pModel->m_pCurrentMaterial->textureReflection;
                    }
                  }
                }
              }
            }
          }
        }
        it._M_current._4_4_ = 2;
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        uVar2 = std::__cxx11::string::size();
        iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
        if (iVar3 != 0) {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          uVar2 = std::__cxx11::string::size();
          iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
          if (iVar3 != 0) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            uVar2 = std::__cxx11::string::size();
            iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
            if (iVar3 != 0) {
              pcVar6 = (char *)std::__cxx11::string::c_str();
              uVar2 = std::__cxx11::string::size();
              iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
              if (iVar3 != 0) {
                pcVar6 = (char *)std::__cxx11::string::c_str();
                uVar2 = std::__cxx11::string::size();
                iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
                if (iVar3 != 0) {
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  uVar2 = std::__cxx11::string::size();
                  iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
                  if (iVar3 != 0) {
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    uVar2 = std::__cxx11::string::size();
                    iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
                    if (iVar3 == 0) {
                      it._M_current._4_4_ = 3;
                    }
                    else {
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      uVar2 = std::__cxx11::string::size();
                      iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
                      if (iVar3 != 0) {
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        uVar2 = std::__cxx11::string::size();
                        iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
                        if (iVar3 != 0) {
                          pcVar6 = (char *)std::__cxx11::string::c_str();
                          uVar2 = std::__cxx11::string::size();
                          iVar3 = ASSIMP_strincmp(pcVar5,pcVar6,uVar2);
                          if (iVar3 != 0) goto LAB_00b1d9fc;
                        }
                      }
                      it._M_current._4_4_ = 4;
                    }
                    goto LAB_00b1d9fc;
                  }
                }
              }
            }
          }
        }
        it._M_current._4_4_ = 2;
      }
    }
LAB_00b1d9fc:
    for (local_dc = 0; local_dc < it._M_current._4_4_; local_dc = local_dc + 1) {
      _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
      (this->m_DataIt)._M_current = _Var4._M_current;
    }
  } while( true );
}

Assistant:

void ObjFileMtlImporter::getTextureOption(bool &clamp, int &clampIndex, aiString *&out) {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);

    // If there is any more texture option
    while (!isEndOfBuffer(m_DataIt, m_DataItEnd) && *m_DataIt == '-')
    {
        const char *pPtr( &(*m_DataIt) );
        //skip option key and value
        int skipToken = 1;

        if (!ASSIMP_strincmp(pPtr, ClampOption.c_str(), static_cast<unsigned int>(ClampOption.size())))
        {
            DataArrayIt it = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
            char value[3];
            CopyNextWord(it, m_DataItEnd, value, sizeof(value) / sizeof(*value));
            if (!ASSIMP_strincmp(value, "on", 2))
            {
                clamp = true;
            }

            skipToken = 2;
        }
        else if( !ASSIMP_strincmp( pPtr, TypeOption.c_str(), static_cast<unsigned int>(TypeOption.size()) ) )
        {
            DataArrayIt it = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
            char value[ 12 ];
            CopyNextWord( it, m_DataItEnd, value, sizeof( value ) / sizeof( *value ) );
            if( !ASSIMP_strincmp( value, "cube_top", 8 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeTopType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }
            else if( !ASSIMP_strincmp( value, "cube_bottom", 11 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBottomType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[1];
            }
            else if( !ASSIMP_strincmp( value, "cube_front", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeFrontType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[2];
            }
            else if( !ASSIMP_strincmp( value, "cube_back", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBackType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[3];
            }
            else if( !ASSIMP_strincmp( value, "cube_left", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeLeftType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[4];
            }
            else if( !ASSIMP_strincmp( value, "cube_right", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeRightType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[5];
            }
            else if( !ASSIMP_strincmp( value, "sphere", 6 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionSphereType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }

            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, BlendUOption.c_str(), static_cast<unsigned int>(BlendUOption.size()))
                || !ASSIMP_strincmp(pPtr, BlendVOption.c_str(), static_cast<unsigned int>(BlendVOption.size()))
                || !ASSIMP_strincmp(pPtr, BoostOption.c_str(), static_cast<unsigned int>(BoostOption.size()))
                || !ASSIMP_strincmp(pPtr, ResolutionOption.c_str(), static_cast<unsigned int>(ResolutionOption.size()))
                || !ASSIMP_strincmp(pPtr, BumpOption.c_str(), static_cast<unsigned int>(BumpOption.size()))
                || !ASSIMP_strincmp(pPtr, ChannelOption.c_str(), static_cast<unsigned int>(ChannelOption.size())))
        {
            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, ModifyMapOption.c_str(), static_cast<unsigned int>(ModifyMapOption.size())))
        {
            skipToken = 3;
        }
        else if (  !ASSIMP_strincmp(pPtr, OffsetOption.c_str(), static_cast<unsigned int>(OffsetOption.size()))
                || !ASSIMP_strincmp(pPtr, ScaleOption.c_str(), static_cast<unsigned int>(ScaleOption.size()))
                || !ASSIMP_strincmp(pPtr, TurbulenceOption.c_str(), static_cast<unsigned int>(TurbulenceOption.size()))
                )
        {
            skipToken = 4;
        }

        for (int i = 0; i < skipToken; ++i)
        {
            m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
        }
    }
}